

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O0

int BN_print(void *fp,BIGNUM *a)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int local_2c;
  int v;
  int j;
  int i;
  int z;
  BIGNUM *a_local;
  BIO *bp_local;
  
  if ((a->neg == 0) || (iVar2 = BIO_write((BIO *)fp,"-",1), iVar2 == 1)) {
    iVar2 = BN_is_zero((BIGNUM *)a);
    if ((iVar2 == 0) || (iVar2 = BIO_write((BIO *)fp,"0",1), iVar2 == 1)) {
      bVar1 = false;
      v = bn_minimal_width((BIGNUM *)a);
      while (v = v + -1, -1 < v) {
        for (local_2c = 0x3c; -1 < local_2c; local_2c = local_2c + -4) {
          uVar3 = a->d[v] >> ((byte)local_2c & 0x3f);
          if ((bVar1) || ((uVar3 & 0xf) != 0)) {
            iVar2 = BIO_write((BIO *)fp,"0123456789abcdef" + (int)((uint)uVar3 & 0xf),1);
            if (iVar2 != 1) {
              return 0;
            }
            bVar1 = true;
          }
        }
      }
      bp_local._4_4_ = 1;
    }
    else {
      bp_local._4_4_ = 0;
    }
  }
  else {
    bp_local._4_4_ = 0;
  }
  return bp_local._4_4_;
}

Assistant:

int BN_print(BIO *bp, const BIGNUM *a) {
  if (a->neg && BIO_write(bp, "-", 1) != 1) {
    return 0;
  }

  if (BN_is_zero(a) && BIO_write(bp, "0", 1) != 1) {
    return 0;
  }

  int z = 0;
  for (int i = bn_minimal_width(a) - 1; i >= 0; i--) {
    for (int j = BN_BITS2 - 4; j >= 0; j -= 4) {
      // strip leading zeros
      int v = ((int)(a->d[i] >> (long)j)) & 0x0f;
      if (z || v != 0) {
        if (BIO_write(bp, &hextable[v], 1) != 1) {
          return 0;
        }
        z = 1;
      }
    }
  }
  return 1;
}